

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUint8x16OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDUint8x16Operation::OpLessThanOrEqual(SIMDValue *aValue,SIMDValue *bValue)

{
  ulong uVar1;
  ulong uVar2;
  _x86_SIMDValue _Var3;
  _x86_SIMDValue _Var4;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar5;
  X86SIMDValue signBits;
  X86SIMDValue tmpbValue;
  X86SIMDValue tmpaValue;
  X86SIMDValue x86Result;
  SIMDValue *bValue_local;
  SIMDValue *aValue_local;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char local_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  
  _Var3 = _x86_SIMDValue::ToX86SIMDValue(aValue);
  _Var4 = _x86_SIMDValue::ToX86SIMDValue(bValue);
  tmpbValue.field_0.i64[1] = _Var3.field_0._0_8_;
  uVar1 = tmpbValue.field_0.i64[1] ^ 0x8080808080808080;
  signBits.field_0.i64[1] = _Var4.field_0._0_8_;
  uVar2 = signBits.field_0.i64[1] ^ 0x8080808080808080;
  local_18 = (char)uVar2;
  cStack_17 = (char)(uVar2 >> 8);
  cStack_16 = (char)(uVar2 >> 0x10);
  cStack_15 = (char)(uVar2 >> 0x18);
  cStack_14 = (char)(uVar2 >> 0x20);
  cStack_13 = (char)(uVar2 >> 0x28);
  cStack_12 = (char)(uVar2 >> 0x30);
  cStack_11 = (char)(uVar2 >> 0x38);
  local_28 = (char)uVar1;
  cStack_27 = (char)(uVar1 >> 8);
  cStack_26 = (char)(uVar1 >> 0x10);
  cStack_25 = (char)(uVar1 >> 0x18);
  cStack_24 = (char)(uVar1 >> 0x20);
  cStack_23 = (char)(uVar1 >> 0x28);
  cStack_22 = (char)(uVar1 >> 0x30);
  cStack_21 = (char)(uVar1 >> 0x38);
  tmpaValue.field_0.i8[9] = -(cStack_27 < cStack_17);
  tmpaValue.field_0.i8[8] = -(local_28 < local_18);
  tmpaValue.field_0.i8[10] = -(cStack_26 < cStack_16);
  tmpaValue.field_0.i8[0xb] = -(cStack_25 < cStack_15);
  tmpaValue.field_0.i8[0xc] = -(cStack_24 < cStack_14);
  tmpaValue.field_0.i8[0xd] = -(cStack_23 < cStack_13);
  tmpaValue.field_0.i8[0xe] = -(cStack_22 < cStack_12);
  tmpaValue.field_0.i8[0xf] = -(cStack_21 < cStack_11);
  tmpbValue.field_0.i8[9] = -(cStack_27 == cStack_17);
  tmpbValue.field_0.i8[8] = -(local_28 == local_18);
  tmpbValue.field_0.i8[10] = -(cStack_26 == cStack_16);
  tmpbValue.field_0.i8[0xb] = -(cStack_25 == cStack_15);
  tmpbValue.field_0.i8[0xc] = -(cStack_24 == cStack_14);
  tmpbValue.field_0.i8[0xd] = -(cStack_23 == cStack_13);
  tmpbValue.field_0.i8[0xe] = -(cStack_22 == cStack_12);
  tmpbValue.field_0.i8[0xf] = -(cStack_21 == cStack_11);
  tmpaValue.field_0.i64[1] = tmpaValue.field_0.i64[1] | tmpbValue.field_0.i64[1];
  aVar5 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&tmpaValue.field_0 + 8));
  return (SIMDValue)aVar5;
}

Assistant:

SIMDValue SIMDUint8x16Operation::OpLessThanOrEqual(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);

#pragma warning(push)
#pragma warning(disable:4838) // conversion from 'unsigned int' to 'int32' requires a narrowing conversion
        X86SIMDValue signBits = { { 0x80808080,0x80808080, 0x80808080, 0x80808080 } };
#pragma warning(pop)

        // Signed comparison of unsigned ints can be done if the ints have the "sign" bit xored with 1
        tmpaValue.m128i_value = _mm_xor_si128(tmpaValue.m128i_value, signBits.m128i_value);
        tmpbValue.m128i_value = _mm_xor_si128(tmpbValue.m128i_value, signBits.m128i_value);
        x86Result.m128i_value = _mm_cmplt_epi8(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a < b?
        tmpaValue.m128i_value = _mm_cmpeq_epi8(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a == b?
        x86Result.m128i_value = _mm_or_si128(x86Result.m128i_value, tmpaValue.m128i_value);   // result = (a<b)|(a==b)

        return X86SIMDValue::ToSIMDValue(x86Result);
    }